

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerGLSL::consume_temporary_in_precision_context
          (CompilerGLSL *this,uint32_t type_id,uint32_t id,Precision precision)

{
  ParsedIR *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar1;
  Types TVar2;
  Variant *pVVar3;
  ulong uVar4;
  ID IVar5;
  bool bVar6;
  SPIRType *pSVar7;
  _Hash_node_base *p_Var8;
  mapped_type *this_01;
  Meta *pMVar9;
  mapped_type *pmVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  __hashtable *__h_1;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar14;
  uint32_t alias_id;
  __node_gen_type __node_gen_1;
  __node_gen_type __node_gen;
  ID local_78;
  ID local_74;
  string local_70;
  string local_50;
  char *local_30;
  
  pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  TVar2 = pVVar3[id].type;
  if ((((TypeUndef < TVar2) || ((0x1208U >> (TVar2 & 0x1f) & 1) == 0)) &&
      (local_78.id = id, pSVar7 = Variant::get<spirv_cross::SPIRType>(pVVar3 + type_id),
      id = local_78.id, pSVar7->pointer != true)) &&
     ((pSVar7->basetype < Double &&
      ((0x2180U >> (pSVar7->basetype & (MeshGridProperties|Int)) & 1) != 0)))) {
    if (precision == DontCare) {
      local_50._M_dataplus._M_p = (pointer)&(this->super_Compiler).forced_temporaries;
      pVar14 = ::std::
               _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                         ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)local_50._M_dataplus._M_p,&local_78);
      id = local_78.id;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
        id = local_78.id;
      }
    }
    else {
      bVar6 = Compiler::has_decoration(&this->super_Compiler,local_78,DecorationRelaxedPrecision);
      id = local_78.id;
      if ((bVar6 ^ Highp) != precision) {
        uVar4 = (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count;
        uVar11 = (ulong)local_78.id % uVar4;
        p_Var12 = (this->temporary_to_mirror_precision_alias)._M_h._M_buckets[uVar11];
        p_Var13 = (__node_base_ptr)0x0;
        if ((p_Var12 != (__node_base_ptr)0x0) &&
           (p_Var8 = p_Var12->_M_nxt, p_Var13 = p_Var12,
           local_78.id != *(uint *)&p_Var12->_M_nxt[1]._M_nxt)) {
          while (p_Var12 = p_Var8, p_Var8 = p_Var12->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
            p_Var13 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var8[1]._M_nxt % uVar4 != uVar11) ||
               (p_Var13 = p_Var12, local_78.id == *(uint *)&p_Var8[1]._M_nxt)) goto LAB_002d7abd;
          }
          p_Var13 = (__node_base_ptr)0x0;
        }
LAB_002d7abd:
        if (p_Var13 == (__node_base_ptr)0x0) {
          p_Var8 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var8 = p_Var13->_M_nxt;
        }
        if (p_Var8 == (_Hash_node_base *)0x0) {
          this_00 = &(this->super_Compiler).ir;
          local_74.id = ParsedIR::increase_bound_by(this_00,1);
          local_50._M_dataplus._M_p._0_4_ = local_74.id;
          this_01 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&(this->super_Compiler).ir.meta,(key_type *)&local_50);
          pMVar9 = ParsedIR::find_meta(this_00,local_78);
          if (pMVar9 != (Meta *)0x0) {
            Meta::operator=(this_01,pMVar9);
          }
          if (precision == Mediump) {
            Compiler::set_decoration(&this->super_Compiler,local_74,DecorationRelaxedPrecision,0);
            local_30 = "mp_copy_";
          }
          else {
            Compiler::unset_decoration(&this->super_Compiler,local_74,DecorationRelaxedPrecision);
            local_30 = "hp_copy_";
          }
          ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          (*(this->super_Compiler)._vptr_Compiler[6])(&local_70,this,(ulong)local_78.id);
          join<char_const*&,std::__cxx11::string>
                    (&local_50,(spirv_cross *)&local_30,(char **)&local_70,ts_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          ParsedIR::sanitize_underscores(&local_50);
          Compiler::set_name(&this->super_Compiler,local_74,&local_50);
          IVar5.id = local_74.id;
          to_expression_abi_cxx11_(&local_70,this,local_78.id,true);
          emit_op(this,type_id,IVar5.id,&local_70,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          IVar5.id = local_74.id;
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->temporary_to_mirror_precision_alias,&local_78.id);
          *pmVar10 = IVar5.id;
          puVar1 = &(this->super_Compiler).forced_temporaries;
          local_70._M_dataplus._M_p = (pointer)puVar1;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)puVar1,&local_78);
          local_70._M_dataplus._M_p = (pointer)puVar1;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)puVar1,&local_74);
          Compiler::force_recompile_guarantee_forward_progress(&this->super_Compiler);
          local_78.id = local_74.id;
          id = local_74.id;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
            id = local_78.id;
          }
        }
        else {
          id = *(uint32_t *)((long)&p_Var8[1]._M_nxt + 4);
        }
      }
    }
  }
  return id;
}

Assistant:

uint32_t CompilerGLSL::consume_temporary_in_precision_context(uint32_t type_id, uint32_t id, Options::Precision precision)
{
	// Constants do not have innate precision.
	auto handle_type = ir.ids[id].get_type();
	if (handle_type == TypeConstant || handle_type == TypeConstantOp || handle_type == TypeUndef)
		return id;

	// Ignore anything that isn't 32-bit values.
	auto &type = get<SPIRType>(type_id);
	if (type.pointer)
		return id;
	if (type.basetype != SPIRType::Float && type.basetype != SPIRType::UInt && type.basetype != SPIRType::Int)
		return id;

	if (precision == Options::DontCare)
	{
		// If precision is consumed as don't care (operations only consisting of constants),
		// we need to bind the expression to a temporary,
		// otherwise we have no way of controlling the precision later.
		auto itr = forced_temporaries.insert(id);
		if (itr.second)
			force_recompile_guarantee_forward_progress();
		return id;
	}

	auto current_precision = has_decoration(id, DecorationRelaxedPrecision) ? Options::Mediump : Options::Highp;
	if (current_precision == precision)
		return id;

	auto itr = temporary_to_mirror_precision_alias.find(id);
	if (itr == temporary_to_mirror_precision_alias.end())
	{
		uint32_t alias_id = ir.increase_bound_by(1);
		auto &m = ir.meta[alias_id];
		if (auto *input_m = ir.find_meta(id))
			m = *input_m;

		const char *prefix;
		if (precision == Options::Mediump)
		{
			set_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "mp_copy_";
		}
		else
		{
			unset_decoration(alias_id, DecorationRelaxedPrecision);
			prefix = "hp_copy_";
		}

		auto alias_name = join(prefix, to_name(id));
		ParsedIR::sanitize_underscores(alias_name);
		set_name(alias_id, alias_name);

		emit_op(type_id, alias_id, to_expression(id), true);
		temporary_to_mirror_precision_alias[id] = alias_id;
		forced_temporaries.insert(id);
		forced_temporaries.insert(alias_id);
		force_recompile_guarantee_forward_progress();
		id = alias_id;
	}
	else
	{
		id = itr->second;
	}

	return id;
}